

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_result_t result)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  __cxx11 local_68 [35];
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  ze_result_t result_local;
  
  this = (string *)CONCAT44(in_register_0000003c,result);
  psStack_10 = this;
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_SUCCESS",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_NOT_READY",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_ESI == 0x78000001) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNINITIALIZED",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_ESI == 0x70000001) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_DEVICE_LOST",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_ESI == 0x78000004) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_ARGUMENT",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (in_ESI == 0x70000002) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (in_ESI == 0x70000003) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (in_ESI == 0x70000004) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_MODULE_BUILD_FAILURE",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (in_ESI == 0x70010000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (in_ESI == 0x70010001) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_NOT_AVAILABLE",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (in_ESI == 0x78000002) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_VERSION",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (in_ESI == 0x78000003) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_FEATURE",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (in_ESI == 0x78000005) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_NULL_HANDLE",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else if (in_ESI == 0x78000006) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (in_ESI == 0x78000007) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_NULL_POINTER",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  else if (in_ESI == 0x78000008) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_SIZE",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
  }
  else if (in_ESI == 0x78000009) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_SIZE",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
  }
  else if (in_ESI == 0x7800000a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else if (in_ESI == 0x7800000b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (in_ESI == 0x7800000c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_ENUMERATION",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else if (in_ESI == 0x7800000d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  else if (in_ESI == 0x7800000e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else if (in_ESI == 0x7800000f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_NATIVE_BINARY",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  }
  else if (in_ESI == 0x78000010) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_GLOBAL_NAME",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  }
  else if (in_ESI == 0x78000011) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_KERNEL_NAME",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
  }
  else if (in_ESI == 0x78000012) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_FUNCTION_NAME",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  }
  else if (in_ESI == 0x78000013) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if (in_ESI == 0x78000014) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION",&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else if (in_ESI == 0x78000015) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX",&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_40);
  }
  else if (in_ESI == 0x78000016) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else if (in_ESI == 0x78000017) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE",&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
  }
  else if (in_ESI == 0x78000019) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE",&local_43);
    std::allocator<char>::~allocator((allocator<char> *)&local_43);
  }
  else if (in_ESI == 0x7800001a) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_OVERLAPPING_REGIONS",&local_44);
    std::allocator<char>::~allocator((allocator<char> *)&local_44);
  }
  else if (in_ESI == 0x7ffffffe) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_RESULT_ERROR_UNKNOWN",&local_45);
    std::allocator<char>::~allocator((allocator<char> *)&local_45);
  }
  else {
    std::__cxx11::to_string(local_68,in_ESI);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown ze_result_t value: ");
    std::__cxx11::string::~string((string *)local_68);
  }
  return this;
}

Assistant:

std::string to_string(const ze_result_t result) {
  if (result == ZE_RESULT_SUCCESS) {
    return "ZE_RESULT_SUCCESS";
  } else if (result == ZE_RESULT_NOT_READY) {
    return "ZE_RESULT_NOT_READY";
  } else if (result == ZE_RESULT_ERROR_UNINITIALIZED) {
    return "ZE_RESULT_ERROR_UNINITIALIZED";
  } else if (result == ZE_RESULT_ERROR_DEVICE_LOST) {
    return "ZE_RESULT_ERROR_DEVICE_LOST";
  } else if (result == ZE_RESULT_ERROR_INVALID_ARGUMENT) {
    return "ZE_RESULT_ERROR_INVALID_ARGUMENT";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
  } else if (result == ZE_RESULT_ERROR_MODULE_BUILD_FAILURE) {
    return "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
  } else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
    return "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
  } else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
    return "ZE_RESULT_ERROR_NOT_AVAILABLE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_VERSION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_FEATURE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_HANDLE) {
    return "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
  } else if (result == ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE) {
    return "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_POINTER) {
    return "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
  } else if (result == ZE_RESULT_ERROR_INVALID_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_SIZE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
  } else if (result == ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT) {
    return "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
  } else if (result == ZE_RESULT_ERROR_INVALID_ENUMERATION) {
    return "ZE_RESULT_ERROR_INVALID_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
  } else if (result == ZE_RESULT_ERROR_INVALID_NATIVE_BINARY) {
    return "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_FUNCTION_NAME) {
    return "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
  } else if (result == ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE) {
    return "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
  } else if (result == ZE_RESULT_ERROR_OVERLAPPING_REGIONS) {
    return "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
  } else if (result == ZE_RESULT_ERROR_UNKNOWN) {
    return "ZE_RESULT_ERROR_UNKNOWN";
  } else {
    return "Unknown ze_result_t value: " +
      std::to_string(static_cast<int>(result));
  }
}